

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSoftmaxLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  allocator local_121;
  undefined1 local_120 [32];
  Result local_100;
  undefined1 local_d0 [32];
  undefined1 local_b0 [40];
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result_conflict *)(local_b0 + 0x28),local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_b0 + 0x28));
    Result::~Result((Result *)(local_b0 + 0x28));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    pNVar1 = local_20;
    if ((bVar2) && ((this->ndArrayInterpretation & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_d0,"Softmax",
                 (allocator *)((long)local_100.m_message._M_storage._M_storage + 7));
      validateInputOutputRankEquality
                ((Result_conflict *)local_b0,pNVar1,(string *)local_d0,&this->blobNameToRank);
      Result::operator=((Result *)__return_storage_ptr__,(Result *)local_b0);
      Result::~Result((Result *)local_b0);
      std::__cxx11::string::~string((string *)local_d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_100.m_message._M_storage._M_storage + 7));
      bVar2 = Result::good((Result *)__return_storage_ptr__);
      pNVar1 = local_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_120,"Softmax",&local_121);
        validateRankCount((Result_conflict *)(local_120 + 0x20),pNVar1,(string *)local_120,3,-1,
                          &this->blobNameToRank);
        Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_120 + 0x20));
        Result::~Result((Result *)(local_120 + 0x20));
        std::__cxx11::string::~string((string *)local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSoftmaxLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Softmax", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Softmax", 3, -1, blobNameToRank);
    }
    return r;
}